

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O2

string * rcg::anon_unknown_4::toLower
                   (string *__return_storage_ptr__,string *s,size_t start,size_t size)

{
  int iVar1;
  ulong uVar2;
  ostringstream out;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  uVar2 = size + start;
  if (s->_M_string_length <= size + start) {
    uVar2 = s->_M_string_length;
  }
  for (; start < uVar2; start = start + 1) {
    iVar1 = tolower((int)(s->_M_dataplus)._M_p[start]);
    std::operator<<((ostream *)local_1a0,(char)iVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toLower(const std::string &s, size_t start, size_t size)
{
  std::ostringstream out;

  size_t end=std::min(s.size(), start+size);

  while (start < end)
  {
    out << static_cast<char>(std::tolower(s[start++]));
  }

  return out.str();
}